

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O0

_Bool get_fullpath(char *path,char *dest)

{
  char *pcVar1;
  char *in_RSI;
  char *in_RDI;
  
  pcVar1 = realpath(in_RDI,in_RSI);
  if (pcVar1 == (char *)0x0) {
    clear_path_string(in_RDI,(size_t)in_RSI);
  }
  return pcVar1 != (char *)0x0;
}

Assistant:

bool get_fullpath(const char *path, char *dest)
{
#if defined(_WIN32)
	if (_fullpath(dest, path, MAX_PATH) == NULL)
#else
	if (realpath(path, dest) == NULL)
#endif
	{
		clear_path_string(dest, MAX_PATH);
		return false;
	}
	return true;
}